

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O2

void stumpless_unload_entry_and_contents(stumpless_entry *entry)

{
  ulong uVar1;
  
  if (entry != (stumpless_entry *)0x0) {
    for (uVar1 = 0; uVar1 < entry->element_count; uVar1 = uVar1 + 1) {
      stumpless_unload_element_and_contents(entry->elements[uVar1]);
    }
    unchecked_unload_entry(entry);
    return;
  }
  return;
}

Assistant:

void
stumpless_unload_entry_and_contents( const struct stumpless_entry *entry ) {
  size_t i;

  if( !entry ) {
    return;
  }

  for( i = 0; i < entry->element_count; i++ ) {
    stumpless_unload_element_and_contents( entry->elements[i] );
  }

  unchecked_unload_entry( entry );
}